

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

int generate_key_from_aid(char *account_id,uint8_t *key)

{
  short sVar1;
  long lVar2;
  long lVar3;
  char byte [3];
  uint8_t aid [8];
  
  lVar3 = 0;
  do {
    if (lVar3 == 8) {
      if (account_id[0x10] != '\0') {
        return -1;
      }
      cma_keygen(aid,key);
      return 0;
    }
    sVar1 = *(short *)(account_id + lVar3 * 2);
    byte[2] = '\0';
    byte._0_2_ = sVar1;
    lVar2 = strtol(byte,(char **)0x0,0x10);
    aid[lVar3] = (uint8_t)lVar2;
    lVar3 = lVar3 + 1;
  } while (((uint8_t)lVar2 != '\0') || (sVar1 == 0x3030));
  return -1;
}

Assistant:

int generate_key_from_aid(const char *account_id, uint8_t key[0x20]) {
  int i;
  uint8_t aid[8];
  for (i = 0; i < 0x08; i++) {
    char byte[3];
    memcpy(byte, &account_id[2*i], 2);
    byte[2] = '\0';
    aid[i] = strtol(byte, NULL, 16);
    if (aid[i] == 0 && !(byte[0] == '0' && byte[1] == '0')) {
      return -1;
    }
  }
  if (account_id[2*i] != '\0') {
    return -1;
  }
  cma_keygen(aid, key);
  return 0;
}